

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

UniValue *
wallet::FinishTransaction
          (UniValue *__return_storage_ptr__,shared_ptr<wallet::CWallet> *pwallet,UniValue *options,
          CMutableTransaction *rawTx)

{
  pointer pcVar1;
  UniValue *pUVar2;
  CWallet *this;
  string key;
  string key_00;
  string key_01;
  string key_02;
  mapValue_t mapValue;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  Span<const_unsigned_char> input;
  bool bVar3;
  optional<common::PSBTError> oVar4;
  UniValue *pUVar5;
  undefined7 extraout_var;
  ulong uVar6;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  undefined1 in_stack_fffffffffffffb48 [12];
  uint in_stack_fffffffffffffb54;
  pointer in_stack_fffffffffffffb58;
  pointer in_stack_fffffffffffffb60;
  pointer in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  undefined1 local_488 [16];
  CMutableTransaction mtx;
  bool complete;
  UniValue local_438;
  long *local_3e0 [2];
  long local_3d0 [2];
  UniValue local_3c0;
  long *local_368 [2];
  long local_358 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  UniValue local_310;
  long *local_2b8 [2];
  long local_2a8 [2];
  undefined1 local_298 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_280 [4];
  CTransactionRef tx;
  undefined1 local_208 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<UniValue,_std::allocator<UniValue>_> local_1b8;
  long *local_1a0 [2];
  long local_190 [2];
  size_t i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined8 local_14f;
  undefined4 local_147;
  undefined2 local_143;
  char local_141;
  PartiallySignedTransaction psbtx;
  
  pUVar2 = *(UniValue **)(in_FS_OFFSET + 0x28);
  PartiallySignedTransaction::PartiallySignedTransaction(&psbtx,rawTx);
  CWallet::FillPSBT((pwallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr,&psbtx,&complete,0,false,true,(size_t *)0x0,true);
  oVar4 = CWallet::FillPSBT((pwallet->
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                            &psbtx,&complete,0,true,false,(size_t *)0x0,true);
  if (((ulong)oVar4.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
              super__Optional_payload_base<common::PSBTError> >> 0x20 & 1) == 0) {
    CMutableTransaction::CMutableTransaction(&mtx);
    complete = FinalizeAndExtractPSBT(&psbtx,&mtx);
    local_160 = &local_150;
    __return_storage_ptr__->typ = VOBJ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_14f;
    *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_147;
    *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_143;
    (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_141;
    (__return_storage_ptr__->val)._M_string_length = 0;
    local_158 = 0;
    local_150 = 0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar1 = local_298 + 0x10;
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"psbt","");
    bVar3 = ::UniValue::findKey(options,(string *)local_298,&i);
    if (bVar3) {
      i = (size_t)&local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i,"psbt","");
      pUVar5 = ::UniValue::operator[](options,(string *)&i);
      bVar3 = ::UniValue::get_bool(pUVar5);
      uVar6 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)i != &local_170) {
        operator_delete((void *)i,local_170._M_allocated_capacity + 1);
      }
    }
    else {
      uVar6 = 0;
    }
    if ((pointer)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"add_to_wallet","");
    bVar3 = ::UniValue::findKey(options,(string *)local_298,&i);
    if (bVar3) {
      i = (size_t)&local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i,"add_to_wallet","");
      pUVar5 = ::UniValue::operator[](options,(string *)&i);
      bVar3 = ::UniValue::get_bool(pUVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)i != &local_170) {
        operator_delete((void *)i,local_170._M_allocated_capacity + 1);
      }
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    if ((pointer)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if (((char)uVar6 != '\0') || ((byte)(complete ^ 1U | bVar3) == 1)) {
      in_stack_fffffffffffffb54 = (uint)uVar6;
      local_298._16_8_ = 0;
      avStack_280[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      PartiallySignedTransaction::Serialize<DataStream>(&psbtx,(DataStream *)local_298);
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"psbt","");
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_208;
      std::__cxx11::string::_M_construct<unsigned_char_const*>
                ((string *)&tx,
                 (pointer)(local_298._0_8_ +
                          (long)avStack_280[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start),local_298._8_8_);
      input.m_size = (size_t)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
      input.m_data = (uchar *)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
      EncodeBase64_abi_cxx11_((string *)&i,input);
      ::UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)(local_208 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      key._M_string_length._4_4_ = in_stack_fffffffffffffb54;
      key._0_12_ = in_stack_fffffffffffffb48;
      key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
      key.field_2._8_8_ = in_stack_fffffffffffffb60;
      val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
      val._0_8_ = in_stack_fffffffffffffb68;
      val.val._M_string_length = local_488._0_8_;
      val.val.field_2._M_allocated_capacity = local_488._8_8_;
      val.val.field_2._8_8_ =
           mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
           ._M_start;
      val._40_48_ = mtx._8_48_;
      ::UniValue::pushKV(__return_storage_ptr__,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,(ulong)(local_1e0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)i != &local_170) {
        operator_delete((void *)i,local_170._M_allocated_capacity + 1);
      }
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_208) {
        operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(ulong)((((COutPoint *)local_208._0_8_)->hash).m_wrapped.
                                 super_base_blob<256U>.m_data._M_elems + 1));
      }
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0],local_190[0] + 1);
      }
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_298);
      uVar6 = (ulong)in_stack_fffffffffffffb54;
    }
    if ((complete & 1U) != 0) {
      CTransaction::CTransaction((CTransaction *)local_298,&mtx);
      EncodeHexTx_abi_cxx11_((string *)&i,(CTransaction *)local_298);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_280);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_298);
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (CTransaction **)&tx,(allocator<CTransaction> *)local_298,&mtx);
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"txid","");
      base_blob<256u>::GetHex_abi_cxx11_
                ((string *)local_298,
                 &(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash);
      ::UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      key_00._M_string_length._4_4_ = in_stack_fffffffffffffb54;
      key_00._0_12_ = in_stack_fffffffffffffb48;
      key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
      key_00.field_2._8_8_ = in_stack_fffffffffffffb60;
      val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
      val_00._0_8_ = in_stack_fffffffffffffb68;
      val_00.val._M_string_length = local_488._0_8_;
      val_00.val.field_2._M_allocated_capacity = local_488._8_8_;
      val_00.val.field_2._8_8_ =
           mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
           ._M_start;
      val_00._40_48_ = mtx._8_48_;
      ::UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_310.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_310.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.val._M_dataplus._M_p != &local_310.val.field_2) {
        operator_delete(local_310.val._M_dataplus._M_p,
                        local_310.val.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if ((char)uVar6 == '\0' && bVar3 == false) {
        this = (pwallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_488._0_8_ =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_488._8_8_ =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )->_M_use_count =
                 (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )->_M_use_count =
                 (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        local_348._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_348._M_impl.super__Rb_tree_header._M_header;
        local_348._M_impl._0_8_ = 0;
        local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_348._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
        in_stack_fffffffffffffb58 = (pointer)0x0;
        in_stack_fffffffffffffb60 = (pointer)0x0;
        in_stack_fffffffffffffb68 = (pointer)0x0;
        mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffb70;
        mapValue._M_t._M_impl._0_40_ =
             ZEXT1640(CONCAT412(in_stack_fffffffffffffb54,in_stack_fffffffffffffb48));
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_348;
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_488;
        local_348._M_impl.super__Rb_tree_header._M_header._M_right =
             local_348._M_impl.super__Rb_tree_header._M_header._M_left;
        CWallet::CommitTransaction(this,tx_00,mapValue,orderForm);
        _GLOBAL__N_1::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xfffffffffffffb58);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_348);
        if ((pointer)local_488._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
        }
      }
      else {
        local_368[0] = local_358;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"hex","");
        ::UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
        key_01._M_string_length._4_4_ = in_stack_fffffffffffffb54;
        key_01._0_12_ = in_stack_fffffffffffffb48;
        key_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
        key_01.field_2._8_8_ = in_stack_fffffffffffffb60;
        val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
        val_01._0_8_ = in_stack_fffffffffffffb68;
        val_01.val._M_string_length = local_488._0_8_;
        val_01.val.field_2._M_allocated_capacity = local_488._8_8_;
        val_01.val.field_2._8_8_ =
             mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
        val_01._40_48_ = mtx._8_48_;
        ::UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3c0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0.val._M_dataplus._M_p != &local_3c0.val.field_2) {
          operator_delete(local_3c0.val._M_dataplus._M_p,
                          local_3c0.val.field_2._M_allocated_capacity + 1);
        }
        if (local_368[0] != local_358) {
          operator_delete(local_368[0],local_358[0] + 1);
        }
      }
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)i != &local_170) {
        operator_delete((void *)i,local_170._M_allocated_capacity + 1);
      }
    }
    local_3e0[0] = local_3d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"complete","");
    ::UniValue::UniValue<bool_&,_bool,_true>(&local_438,&complete);
    key_02._M_string_length._4_4_ = in_stack_fffffffffffffb54;
    key_02._0_12_ = in_stack_fffffffffffffb48;
    key_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
    key_02.field_2._8_8_ = in_stack_fffffffffffffb60;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
    val_02._0_8_ = in_stack_fffffffffffffb68;
    val_02.val._M_string_length = local_488._0_8_;
    val_02.val.field_2._M_allocated_capacity = local_488._8_8_;
    val_02.val.field_2._8_8_ =
         mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
         _M_start;
    val_02._40_48_ = mtx._8_48_;
    ::UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_438.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438.val._M_dataplus._M_p != &local_438.val.field_2) {
      operator_delete(local_438.val._M_dataplus._M_p,local_438.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_3e0[0] != local_3d0) {
      operator_delete(local_3e0[0],local_3d0[0] + 1);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
    std::
    _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
    ::~_Rb_tree(&psbtx.m_proprietary._M_t);
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&psbtx.unknown._M_t);
    std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::~vector(&psbtx.outputs);
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::~vector(&psbtx.inputs);
    std::
    _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
    ::~_Rb_tree(&psbtx.m_xpubs._M_t);
    std::_Optional_payload_base<CMutableTransaction>::_M_reset
              ((_Optional_payload_base<CMutableTransaction> *)&psbtx);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == pUVar2) {
      return *(UniValue **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    JSONRPCPSBTError(pUVar5,oVar4.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
                            super__Optional_payload_base<common::PSBTError>._M_payload);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == pUVar2) {
      __cxa_throw(pUVar5,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static UniValue FinishTransaction(const std::shared_ptr<CWallet> pwallet, const UniValue& options, const CMutableTransaction& rawTx)
{
    // Make a blank psbt
    PartiallySignedTransaction psbtx(rawTx);

    // First fill transaction with our data without signing,
    // so external signers are not asked to sign more than once.
    bool complete;
    pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/false, /*bip32derivs=*/true);
    const auto err{pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/true, /*bip32derivs=*/false)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    CMutableTransaction mtx;
    complete = FinalizeAndExtractPSBT(psbtx, mtx);

    UniValue result(UniValue::VOBJ);

    const bool psbt_opt_in{options.exists("psbt") && options["psbt"].get_bool()};
    bool add_to_wallet{options.exists("add_to_wallet") ? options["add_to_wallet"].get_bool() : true};
    if (psbt_opt_in || !complete || !add_to_wallet) {
        // Serialize the PSBT
        DataStream ssTx{};
        ssTx << psbtx;
        result.pushKV("psbt", EncodeBase64(ssTx.str()));
    }

    if (complete) {
        std::string hex{EncodeHexTx(CTransaction(mtx))};
        CTransactionRef tx(MakeTransactionRef(std::move(mtx)));
        result.pushKV("txid", tx->GetHash().GetHex());
        if (add_to_wallet && !psbt_opt_in) {
            pwallet->CommitTransaction(tx, {}, /*orderForm=*/{});
        } else {
            result.pushKV("hex", hex);
        }
    }
    result.pushKV("complete", complete);

    return result;
}